

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O1

bool __thiscall COLLADASaxFWL::FormulasLoader::end__apply(FormulasLoader *this)

{
  int *piVar1;
  Operator OVar2;
  Formula *pFVar3;
  _func_int **pp_Var4;
  int iVar5;
  _Elt_pointer pOVar6;
  undefined4 extraout_var;
  INode **ppIVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Elt_pointer pvVar8;
  long lVar9;
  ulong uVar10;
  size_t __size;
  bool bVar11;
  NodeVector nodes;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> local_48;
  
  this->mCurrentApplyHasChild = true;
  pvVar8 = (this->mNodeListStack).c.
           super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pvVar8 == (this->mNodeListStack).c.
                super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    bVar11 = false;
  }
  else {
    if (pvVar8 == (this->mNodeListStack).c.
                  super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar8 = (this->mNodeListStack).c.
               super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::vector
              (&local_48,pvVar8 + -1);
    std::
    deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
    ::pop_back(&(this->mNodeListStack).c);
    lVar9 = (long)local_48.
                  super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_48.
                  super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    __size = (long)local_48.
                   super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_48.
                   super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    bVar11 = __size != 0;
    if (bVar11) {
      pOVar6 = (this->mOperatorStack).c.
               super__Deque_base<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pOVar6 == (this->mOperatorStack).c.
                    super__Deque_base<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        pFVar3 = this->mCurrentFormula;
        ppIVar7 = (INode **)malloc(__size);
        (pFVar3->mMathmlAsts).mData = ppIVar7;
        (pFVar3->mMathmlAsts).mCount = 0;
        (pFVar3->mMathmlAsts).mCapacity = lVar9 >> 3;
        piVar1 = &(pFVar3->mMathmlAsts).mFlags;
        *(byte *)piVar1 = (byte)*piVar1 | 1;
        if (local_48.super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_48.super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar9 = 0;
          uVar10 = 0;
          do {
            COLLADAFW::ArrayPrimitiveType<MathML::AST::INode_*>::append
                      (&this->mCurrentFormula->mMathmlAsts,
                       (INode **)
                       ((long)local_48.
                              super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar9));
            uVar10 = uVar10 + 1;
            lVar9 = lVar9 + 8;
          } while (uVar10 < (ulong)((long)local_48.
                                          super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_48.
                                          super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
      }
      else {
        if (pOVar6 == (this->mOperatorStack).c.
                      super__Deque_base<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pOVar6 = (this->mOperatorStack).c.
                   super__Deque_base<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
        }
        OVar2 = pOVar6[-1];
        std::deque<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>::pop_back
                  (&(this->mOperatorStack).c);
        iVar5 = (*(this->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x146])(this,(ulong)OVar2);
        if ((char)iVar5 == '\0') {
          if (OVar2 == USER_DEFINED_FUNCTION) {
            iVar5 = (*(this->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x145])(this,&local_48);
            (*(this->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x147])
                      (this,CONCAT44(extraout_var_00,iVar5));
          }
          else {
            pp_Var4 = (this->super_HelperLoaderBase)._vptr_HelperLoaderBase;
            if (__size == 8) {
              iVar5 = (*pp_Var4[0x13f])(this,&local_48,(ulong)OVar2);
              (*(this->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x147])
                        (this,CONCAT44(extraout_var_01,iVar5));
            }
            else {
              iVar5 = (*pp_Var4[0x140])(this,&local_48,(ulong)OVar2);
              (*(this->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x147])
                        (this,CONCAT44(extraout_var_02,iVar5));
            }
          }
        }
        else {
          iVar5 = (*(this->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x144])
                            (this,&local_48,(ulong)OVar2);
          (*(this->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x147])
                    (this,CONCAT44(extraout_var,iVar5));
        }
      }
    }
    if (local_48.super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar11;
}

Assistant:

bool FormulasLoader::end__apply()
	{
		mCurrentApplyHasChild = true;

		if ( mNodeListStack.empty() )
		{
			// TODO error handling
			return false;
		}

		NodeVector nodes = mNodeListStack.top();
		mNodeListStack.pop();
		size_t numOfNodes = nodes.size();

		if ( numOfNodes == 0 )
		{
			// TODO error handling
			return false;
		}

		if ( mOperatorStack.empty() )
		{
			mCurrentFormula->getMathmlAsts().allocMemory( nodes.size() );
			for (size_t i=0; i<nodes.size(); ++i)
			{
				mCurrentFormula->getMathmlAsts().append( nodes[ i ] );
			}
		}
		else
		{
			Operator op = mOperatorStack.top();
			mOperatorStack.pop();

			if ( isFunction( op ) )
			{
				MathML::AST::INode* node = createFunctionOperation( nodes, op );
				appendNewNode( node );
			}
			else if ( op == USER_DEFINED_FUNCTION )
			{
				MathML::AST::INode* node = createUserDefinedFunctionOperation( nodes );
				appendNewNode( node );
			}
			else
			{
				switch ( numOfNodes )
				{

				case 1:
					{
						MathML::AST::INode* node = createUnaryOperation( nodes, op );
						appendNewNode( node );
						break;
					}
				default:
					{
						MathML::AST::INode* node = createMultiOperandOperation( nodes, op );
						appendNewNode( node );
						break;
					}
				}
			}
		}

		return true;
	}